

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O0

unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> __thiscall
amrex::MultiFab::OverlapMask(MultiFab *this,Periodicity *period)

{
  int iVar1;
  undefined1 uVar2;
  bool bVar3;
  MFIter *mfi_00;
  Box *bx_00;
  type isects_00;
  BaseFab<double> *this_00;
  FabArrayBase *in_RSI;
  _Head_base<0UL,_amrex::MultiFab_*,_false> in_RDI;
  Box *b;
  pair<int,_amrex::Box> *is;
  iterator __end4;
  iterator __begin4;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *__range4;
  IntVect *iv;
  const_iterator __end3;
  const_iterator __begin3;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *__range3;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<double> *arr;
  Box *bx;
  MFIter mfi;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  bool run_on_gpu;
  Vector<amrex::Array4BoxTag<double>,_std::allocator<amrex::Array4BoxTag<double>_>_> tags;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *pshifts;
  DistributionMapping *dm;
  BoxArray *ba;
  __single_object *p;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffbd0;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffbd8;
  FabArray<amrex::FArrayBox> *pFVar4;
  BoxArray *in_stack_fffffffffffffbe0;
  undefined8 in_stack_fffffffffffffbf0;
  uchar flags_;
  FabArrayBase *in_stack_fffffffffffffbf8;
  long *plVar5;
  MFIter *in_stack_fffffffffffffc00;
  int *in_stack_fffffffffffffc08;
  undefined7 in_stack_fffffffffffffc10;
  undefined1 in_stack_fffffffffffffc17;
  BoxArray *this_01;
  BoxArray *__args_5;
  undefined1 local_3b8 [64];
  long local_378;
  long lStack_370;
  long local_368;
  long lStack_360;
  long lStack_358;
  undefined4 uStack_350;
  undefined4 local_34c;
  undefined4 uStack_348;
  undefined8 uStack_344;
  undefined1 local_314 [100];
  reference local_2b0;
  IntVect *local_2a8;
  __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
  local_2a0;
  undefined1 *local_298;
  int local_28c;
  int local_288;
  int local_284;
  _Bit_type *local_280;
  uint local_278;
  _Bit_type *local_26c;
  uint local_264;
  int local_260 [2];
  int local_258;
  int local_250 [2];
  int local_248;
  long local_240 [8];
  long *local_200;
  Box *local_1f8;
  MFIter local_1f0;
  undefined1 local_190 [31];
  byte local_171;
  undefined1 local_158 [24];
  undefined1 *local_140;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined4 local_f4;
  undefined4 local_f0;
  byte local_e9;
  DistributionMapping *local_e8;
  BoxArray *local_e0;
  int local_c0 [2];
  int local_b8;
  Box *local_b0;
  int local_a4;
  int iStack_a0;
  int local_9c;
  _Bit_type *local_98;
  uint local_90;
  Box *local_88;
  int local_80;
  int iStack_7c;
  uint local_78;
  int local_74;
  int local_70;
  int local_6c;
  long *local_68;
  undefined4 local_5c;
  IntVect *local_58;
  undefined4 local_4c;
  IntVect *local_48;
  undefined4 local_3c;
  IntVect *local_38;
  undefined4 local_2c;
  Box *local_28;
  undefined4 local_1c;
  Box *local_18;
  undefined4 local_c;
  Box *local_8;
  
  flags_ = (uchar)((ulong)in_stack_fffffffffffffbf0 >> 0x38);
  this_01 = (BoxArray *)in_RDI._M_head_impl;
  local_e0 = FabArrayBase::boxArray(in_RSI);
  local_e8 = FabArrayBase::DistributionMap(in_RSI);
  local_e9 = 0;
  local_f0 = 1;
  local_f4 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_128 = 0;
  uStack_120 = 0;
  local_108 = 0;
  __args_5 = local_e0;
  MFInfo::MFInfo((MFInfo *)0x12898a1);
  mfi_00 = (MFIter *)FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x12898ab);
  std::
  make_unique<amrex::MultiFab,amrex::BoxArray_const&,amrex::DistributionMapping_const&,int,int,amrex::MFInfo,amrex::FabFactory<amrex::FArrayBox>const&>
            ((BoxArray *)in_RDI._M_head_impl,
             (DistributionMapping *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
             in_stack_fffffffffffffc08,(int *)in_stack_fffffffffffffc00,
             (MFInfo *)in_stack_fffffffffffffbf8,(FabFactory<amrex::FArrayBox> *)__args_5);
  MFInfo::~MFInfo((MFInfo *)0x12898ec);
  Periodicity::shiftIntVect((Periodicity *)this_01);
  local_140 = local_158;
  Vector<amrex::Array4BoxTag<double>,_std::allocator<amrex::Array4BoxTag<double>_>_>::Vector
            ((Vector<amrex::Array4BoxTag<double>,_std::allocator<amrex::Array4BoxTag<double>_>_> *)
             0x1289920);
  uVar2 = Gpu::inLaunchRegion();
  local_171 = uVar2;
  std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::vector
            ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
             0x1289945);
  bx_00 = (Box *)std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
                           ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                            in_stack_fffffffffffffbd0);
  MFIter::MFIter(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,flags_);
  while (bVar3 = MFIter::isValid(&local_1f0), bVar3) {
    isects_00 = std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
                          ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                           in_stack_fffffffffffffbd0);
    this_00 = &FabArray<amrex::FArrayBox>::operator[](in_stack_fffffffffffffbd0,mfi_00)->
               super_BaseFab<double>;
    local_1f8 = BaseFab<double>::box(this_00);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x1289a48);
    plVar5 = local_240;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffffbd8,(MFIter *)in_stack_fffffffffffffbd0);
    local_b0 = local_1f8;
    local_8 = local_1f8;
    local_c = 0;
    local_a4 = (local_1f8->smallend).vect[0];
    local_18 = local_1f8;
    local_1c = 1;
    iStack_a0 = (local_1f8->smallend).vect[1];
    local_260 = *(int (*) [2])(local_1f8->smallend).vect;
    local_28 = local_1f8;
    local_2c = 2;
    local_258 = (local_1f8->smallend).vect[2];
    local_88 = local_1f8;
    local_38 = &local_1f8->bigend;
    local_3c = 0;
    local_80 = local_38->vect[0];
    local_48 = &local_1f8->bigend;
    local_4c = 1;
    iStack_7c = (local_1f8->bigend).vect[1];
    local_280 = *(_Bit_type **)local_38->vect;
    local_58 = &local_1f8->bigend;
    local_5c = 2;
    local_278 = (local_1f8->bigend).vect[2];
    for (local_284 = local_258; iVar1 = iStack_a0, local_284 <= (int)local_278;
        local_284 = local_284 + 1) {
      while (local_288 = iVar1, iVar1 = local_a4, local_288 <= iStack_7c) {
        while (local_28c = iVar1, local_28c <= local_80) {
          local_6c = local_28c;
          local_70 = local_288;
          local_74 = local_284;
          *(undefined8 *)
           (*plVar5 +
           ((long)(local_28c - (int)plVar5[4]) +
            (long)(local_288 - *(int *)((long)plVar5 + 0x24)) * plVar5[1] +
           (long)(local_284 - (int)plVar5[5]) * plVar5[2]) * 8) = 0;
          local_68 = plVar5;
          iVar1 = local_28c + 1;
        }
        iVar1 = local_288 + 1;
      }
    }
    local_298 = local_140;
    local_26c = local_280;
    local_264 = local_278;
    local_250 = local_260;
    local_248 = local_258;
    local_200 = plVar5;
    local_c0 = local_260;
    local_b8 = local_258;
    local_9c = local_258;
    local_98 = local_280;
    local_90 = local_278;
    local_78 = local_278;
    local_2a0._M_current =
         (IntVect *)
         std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::begin
                   ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)mfi_00);
    local_2a8 = (IntVect *)
                std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::end
                          ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)mfi_00);
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                               *)in_stack_fffffffffffffbd0,
                              (__normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                               *)mfi_00), bVar3) {
      local_2b0 = __gnu_cxx::
                  __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                  ::operator*(&local_2a0);
      in_stack_fffffffffffffbe0 = local_e0;
      Box::operator+((Box *)in_stack_fffffffffffffbd0,(IntVect *)mfi_00);
      BoxArray::intersections
                ((BoxArray *)CONCAT17(uVar2,in_stack_fffffffffffffc10),bx_00,
                 (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *
                 )isects_00);
      local_314._60_8_ = local_190;
      local_314._52_8_ =
           std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
           begin((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *
                 )mfi_00);
      local_314._44_8_ =
           std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
           end((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
               mfi_00);
      while (bVar3 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                                 *)in_stack_fffffffffffffbd0,
                                (__normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                                 *)mfi_00), bVar3) {
        local_314._36_8_ =
             __gnu_cxx::
             __normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
             ::operator*((__normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                          *)(local_314 + 0x34));
        Box::operator-((Box *)in_stack_fffffffffffffbd0,(IntVect *)mfi_00);
        pFVar4 = (FabArray<amrex::FArrayBox> *)local_314;
        local_314._28_8_ = pFVar4;
        if ((local_171 & 1) == 0) {
          memcpy(local_3b8,local_200,0x3c);
          LoopConcurrentOnCpu<amrex::MultiFab::OverlapMask(amrex::Periodicity_const&)const::__0>
                    ((Box *)in_RDI._M_head_impl,
                     (anon_class_64_1_ba1d35c1 *)CONCAT17(uVar2,in_stack_fffffffffffffc10));
          in_stack_fffffffffffffbd8 = pFVar4;
        }
        else {
          local_378 = *local_200;
          lStack_370 = local_200[1];
          local_368 = local_200[2];
          lStack_360 = local_200[3];
          lStack_358 = local_200[4];
          uStack_344 = *(undefined8 *)((long)local_200 + 0x34);
          uStack_348 = (undefined4)((ulong)*(undefined8 *)((long)local_200 + 0x2c) >> 0x20);
          uStack_350 = (undefined4)local_200[5];
          local_34c = (undefined4)((ulong)local_200[5] >> 0x20);
          std::vector<amrex::Array4BoxTag<double>,_std::allocator<amrex::Array4BoxTag<double>_>_>::
          push_back((vector<amrex::Array4BoxTag<double>,_std::allocator<amrex::Array4BoxTag<double>_>_>
                     *)in_stack_fffffffffffffbd0,(value_type *)mfi_00);
        }
        __gnu_cxx::
        __normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
        ::operator++((__normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                      *)(local_314 + 0x34));
      }
      __gnu_cxx::
      __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
      ::operator++(&local_2a0);
    }
    MFIter::operator++(&local_1f0);
  }
  MFIter::~MFIter((MFIter *)in_stack_fffffffffffffbd0);
  std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::~vector
            ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
             in_stack_fffffffffffffbe0);
  local_e9 = 1;
  Vector<amrex::Array4BoxTag<double>,_std::allocator<amrex::Array4BoxTag<double>_>_>::~Vector
            ((Vector<amrex::Array4BoxTag<double>,_std::allocator<amrex::Array4BoxTag<double>_>_> *)
             0x128a046);
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~vector
            ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)in_stack_fffffffffffffbe0);
  if ((local_e9 & 1) == 0) {
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               in_stack_fffffffffffffbd0);
  }
  return (unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>)in_RDI._M_head_impl;
}

Assistant:

std::unique_ptr<MultiFab>
MultiFab::OverlapMask (const Periodicity& period) const
{
    BL_PROFILE("MultiFab::OverlapMask()");

    const BoxArray& ba = boxArray();
    const DistributionMapping& dm = DistributionMap();

    auto p = std::make_unique<MultiFab>(ba,dm,1,0, MFInfo(), Factory());

    const std::vector<IntVect>& pshifts = period.shiftIntVect();

    Vector<Array4BoxTag<Real> > tags;

    bool run_on_gpu = Gpu::inLaunchRegion();
#ifdef AMREX_USE_OMP
#pragma omp parallel if (!run_on_gpu)
#endif
    {
        std::vector< std::pair<int,Box> > isects;

        for (MFIter mfi(*p); mfi.isValid(); ++mfi)
        {
            const Box& bx = (*p)[mfi].box();
            Array4<Real> const& arr = p->array(mfi);

            AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
            {
                arr(i,j,k) = Real(0.0);
            });

            for (const auto& iv : pshifts)
            {
                ba.intersections(bx+iv, isects);
                for (const auto& is : isects)
                {
                    Box const& b = is.second-iv;
                    if (run_on_gpu) {
                        tags.push_back({arr,b});
                    } else {
                        amrex::LoopConcurrentOnCpu(b, [=] (int i, int j, int k) noexcept
                        {
                            arr(i,j,k) += Real(1.0);
                        });
                    }
                }
            }
        }
    }

#ifdef AMREX_USE_GPU
    amrex::ParallelFor(tags, 1,
    [=] AMREX_GPU_DEVICE (int i, int j, int k, int n, Array4BoxTag<Real> const& tag) noexcept
    {
        Real* p = tag.dfab.ptr(i,j,k,n);
        Gpu::Atomic::AddNoRet(p, Real(1.0));
    });
#endif

    return p;
}